

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS
ref_node_tet_dquality_dnode0(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality,REF_DBL *d_quality)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  REF_DBL *pRVar5;
  REF_DBL RVar6;
  REF_DBL RVar7;
  uint uVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  double dVar13;
  REF_DBL __x;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double local_3d8;
  REF_DBL temp;
  REF_DBL det;
  double dStack_3a0;
  double local_398;
  REF_DBL l1;
  double local_380;
  double local_378;
  REF_DBL l0;
  double local_360;
  double local_358;
  REF_DBL l5;
  double dStack_340;
  double local_338;
  REF_DBL l4;
  double local_320;
  double local_318;
  REF_DBL l3;
  double local_300;
  double local_2f8;
  REF_DBL l2;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  REF_DBL local_2a8;
  double local_2a0;
  double local_298;
  REF_DBL local_290;
  double local_288;
  double local_280;
  REF_DBL local_278;
  double local_270;
  double local_268;
  REF_DBL local_260;
  double local_258;
  REF_DBL local_250;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  REF_DBL volume_1;
  REF_DBL det_1;
  REF_DBL volume;
  double dStack_210;
  double local_208;
  REF_DBL d_denom [3];
  REF_DBL d_num [3];
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_188;
  double dStack_180;
  double local_178;
  REF_DBL d_volume [3];
  REF_DBL d_volume_in_metric [3];
  REF_DBL d_l2 [3];
  REF_DBL d_l1 [3];
  REF_DBL d_l0 [3];
  REF_DBL jac [9];
  
  if (ref_node->tet_quality == 2) {
    uVar8 = ref_node_tet_dvol_dnode0(ref_node,nodes,&volume_1,&l5);
    if (uVar8 == 0) {
      if (volume_1 <= ref_node->min_volume) {
        *quality = volume_1 - ref_node->min_volume;
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          d_quality[lVar12] = (&l5)[lVar12];
        }
        return 0;
      }
      ref_node_metric_get_log(ref_node,*nodes,d_l0);
      ref_node_metric_get_log(ref_node,nodes[1],d_l1);
      ref_node_metric_get_log(ref_node,nodes[2],d_l2);
      ref_node_metric_get_log(ref_node,nodes[3],d_volume);
      for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
        d_volume_in_metric[lVar12] =
             (d_l0[lVar12] + d_l1[lVar12] + d_l2[lVar12] + d_volume[lVar12]) * 0.25;
      }
      uVar8 = ref_matrix_exp_m(d_volume_in_metric,d_num);
      if (uVar8 == 0) {
        uVar8 = ref_matrix_jacob_m(d_num,jac);
        if (uVar8 == 0) {
          iVar1 = nodes[1];
          pRVar5 = ref_node->real;
          iVar2 = *nodes;
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            d_denom[lVar12] = pRVar5[iVar1 * 0xf + lVar12] - pRVar5[iVar2 * 0xf + lVar12];
          }
          iVar3 = nodes[2];
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            (&l0)[lVar12] = pRVar5[iVar3 * 0xf + lVar12] - pRVar5[iVar2 * 0xf + lVar12];
          }
          iVar4 = nodes[3];
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            (&l1)[lVar12] = pRVar5[iVar4 * 0xf + lVar12] - pRVar5[iVar2 * 0xf + lVar12];
          }
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            (&l2)[lVar12] = pRVar5[iVar3 * 0xf + lVar12] - pRVar5[iVar1 * 0xf + lVar12];
          }
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            (&l3)[lVar12] = pRVar5[iVar4 * 0xf + lVar12] - pRVar5[iVar1 * 0xf + lVar12];
          }
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            (&l4)[lVar12] = pRVar5[iVar4 * 0xf + lVar12] - pRVar5[iVar3 * 0xf + lVar12];
          }
          local_240 = d_num[0];
          local_230 = d_num[1];
          local_2c0 = d_denom[0];
          local_2d0 = d_denom[1];
          local_2c8 = d_denom[2];
          local_248 = local_1c0;
          local_2a8 = l0;
          local_2b8 = local_360;
          local_2b0 = local_358;
          local_290 = l1;
          local_2a0 = local_380;
          local_298 = local_378;
          local_278 = l2;
          local_288 = local_2e0;
          local_280 = local_2d8;
          local_260 = l3;
          local_270 = local_300;
          local_268 = local_2f8;
          local_250 = l4;
          local_258 = local_320;
          local_238 = local_318;
          uVar8 = ref_matrix_vt_m_v_deriv(d_num,d_denom,&temp,&det);
          if (uVar8 == 0) {
            uVar8 = ref_matrix_vt_m_v_deriv(d_num,&l0,&temp,&volume);
            if (uVar8 == 0) {
              uVar8 = ref_matrix_vt_m_v_deriv(d_num,&l1,&temp,&local_188);
              if (uVar8 == 0) {
                uVar8 = ref_matrix_det_m(d_num,&det_1);
                if (uVar8 == 0) {
                  dVar14 = (local_1b0 * local_238 + d_num[2] * local_250 + local_1b8 * local_258) *
                           local_238 +
                           (d_num[2] * local_238 + local_240 * local_250 + local_230 * local_258) *
                           local_250 +
                           (local_1b8 * local_238 + local_230 * local_250 + local_248 * local_258) *
                           local_258 +
                           (local_1b0 * local_268 + local_260 * d_num[2] + local_270 * local_1b8) *
                           local_268 +
                           (d_num[2] * local_268 + local_240 * local_260 + local_230 * local_270) *
                           local_260 +
                           (local_1b8 * local_268 + local_230 * local_260 + local_248 * local_270) *
                           local_270 +
                           (local_1b0 * local_280 + local_278 * d_num[2] + local_288 * local_1b8) *
                           local_280 +
                           (d_num[2] * local_280 + local_240 * local_278 + local_230 * local_288) *
                           local_278 +
                           (local_1b8 * local_280 + local_230 * local_278 + local_248 * local_288) *
                           local_288 +
                           (local_1b0 * local_298 + local_290 * d_num[2] + local_2a0 * local_1b8) *
                           local_298 +
                           (d_num[2] * local_298 + local_240 * local_290 + local_230 * local_2a0) *
                           local_290 +
                           (local_1b8 * local_298 + local_230 * local_290 + local_248 * local_2a0) *
                           local_2a0 +
                           (local_1b0 * local_2b0 + local_2a8 * d_num[2] + local_2b8 * local_1b8) *
                           local_2b0 +
                           (d_num[2] * local_2b0 + local_240 * local_2a8 + local_230 * local_2b8) *
                           local_2a8 +
                           (local_1b8 * local_2b0 + local_230 * local_2a8 + local_248 * local_2b8) *
                           local_2b8 +
                           (local_1b0 * local_2c8 + local_2c0 * d_num[2] + local_2d0 * local_1b8) *
                           local_2c8 +
                           (d_num[2] * local_2c8 + local_240 * local_2c0 + local_230 * local_2d0) *
                           local_2c0 +
                           (local_1b8 * local_2c8 + local_230 * local_2c0 + local_2d0 * local_248) *
                           local_2d0;
                  if (det_1 < 0.0) {
                    dVar15 = sqrt(det_1);
                  }
                  else {
                    dVar15 = SQRT(det_1);
                  }
                  dVar13 = pow(volume_1 * dVar15,0.6666666666666666);
                  dVar18 = pow(volume_1 * dVar15,-0.3333333333333333);
                  dVar16 = dVar14 * 1e+20;
                  if (dVar16 <= -dVar16) {
                    dVar16 = -dVar16;
                  }
                  dVar17 = -dVar13;
                  dVar19 = dVar13;
                  if (dVar13 <= dVar17) {
                    dVar19 = dVar17;
                  }
                  if (dVar19 < dVar16) {
                    dVar15 = dVar15 * dVar18 * 0.6666666666666666;
                    *quality = (dVar13 * 24.9610058766228) / dVar14;
                    dVar16 = dVar14 * dVar14;
                    auVar20._0_8_ =
                         (dVar14 * dVar15 * l5 + ((-det - volume) - local_188) * dVar17) *
                         24.9610058766228;
                    auVar20._8_8_ =
                         (dVar14 * dVar15 * dStack_340 +
                         ((-dStack_3a0 - dStack_210) - dStack_180) * dVar17) * 24.9610058766228;
                    auVar21._8_8_ = dVar16;
                    auVar21._0_8_ = dVar16;
                    auVar21 = divpd(auVar20,auVar21);
                    *(undefined1 (*) [16])d_quality = auVar21;
                    d_quality[2] = ((((-local_398 - local_208) - local_178) * dVar17 +
                                    local_338 * dVar15 * dVar14) * 24.9610058766228) / dVar16;
                    return 0;
                  }
                  *quality = -1.0;
                  *d_quality = 0.0;
                  d_quality[1] = 0.0;
                  d_quality[2] = 0.0;
                  return 0;
                }
                uVar10 = (ulong)uVar8;
                pcVar11 = "det(mavg)";
                uVar9 = 0x729;
              }
              else {
                uVar10 = (ulong)uVar8;
                pcVar11 = "d_e2";
                uVar9 = 0x724;
              }
            }
            else {
              uVar10 = (ulong)uVar8;
              pcVar11 = "d_e1";
              uVar9 = 0x723;
            }
          }
          else {
            uVar10 = (ulong)uVar8;
            pcVar11 = "d_e0";
            uVar9 = 0x722;
          }
        }
        else {
          uVar10 = (ulong)uVar8;
          pcVar11 = "jac";
          uVar9 = 0x709;
        }
      }
      else {
        uVar10 = (ulong)uVar8;
        pcVar11 = "exp";
        uVar9 = 0x708;
      }
    }
    else {
      uVar10 = (ulong)uVar8;
      pcVar11 = "vol";
      uVar9 = 0x6fb;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar9,
           "ref_node_tet_jac_dquality_dnode0",uVar10,pcVar11);
    pcVar11 = "jac";
    uVar9 = 0x755;
  }
  else {
    if (ref_node->tet_quality != 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x758,
             "ref_node_tet_dquality_dnode0","case not recognized");
      return 1;
    }
    uVar8 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[1],&l0,d_l0);
    if (uVar8 == 0) {
      uVar8 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[2],&l1,d_l1);
      if (uVar8 == 0) {
        uVar8 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[3],&l2,d_l2);
        if (uVar8 == 0) {
          uVar8 = ref_node_ratio(ref_node,nodes[1],nodes[2],&l3);
          if (uVar8 == 0) {
            uVar8 = ref_node_ratio(ref_node,nodes[1],nodes[3],&l4);
            if (uVar8 == 0) {
              uVar8 = ref_node_ratio(ref_node,nodes[2],nodes[3],&l5);
              if (uVar8 == 0) {
                uVar8 = ref_node_tet_dvol_dnode0(ref_node,nodes,&volume,d_volume);
                if (uVar8 == 0) {
                  if (volume <= ref_node->min_volume) {
                    *quality = volume - ref_node->min_volume;
                    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                      d_quality[lVar12] = d_volume[lVar12];
                    }
                    return 0;
                  }
                  ref_node_metric_get(ref_node,*nodes,jac);
                  uVar8 = ref_matrix_det_m(jac,&det);
                  __x = det;
                  if (uVar8 == 0) {
                    ref_node_metric_get(ref_node,nodes[1],jac);
                    uVar8 = ref_matrix_det_m(jac,&det);
                    RVar6 = det;
                    if (uVar8 == 0) {
                      ref_node_metric_get(ref_node,nodes[2],jac);
                      uVar8 = ref_matrix_det_m(jac,&det);
                      RVar7 = det;
                      if (uVar8 == 0) {
                        ref_node_metric_get(ref_node,nodes[3],jac);
                        uVar8 = ref_matrix_det_m(jac,&det);
                        if (uVar8 == 0) {
                          if (RVar6 <= __x) {
                            __x = RVar6;
                          }
                          if (RVar7 <= __x) {
                            __x = RVar7;
                          }
                          if (det <= __x) {
                            __x = det;
                          }
                          local_3d8 = SQRT(__x);
                          if (__x < 0.0) {
                            local_3d8 = sqrt(__x);
                          }
                          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                            dVar14 = SQRT(__x);
                            if (__x < 0.0) {
                              dVar14 = sqrt(__x);
                            }
                            d_volume_in_metric[lVar12] = dVar14 * d_volume[lVar12];
                          }
                          dVar14 = pow(volume * local_3d8,0.6666666666666666);
                          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                            dVar15 = pow(volume * local_3d8,-0.3333333333333333);
                            d_num[lVar12] = dVar15 * 0.6666666666666666 * d_volume_in_metric[lVar12]
                            ;
                          }
                          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                            d_denom[lVar12] =
                                 d_l2[lVar12] * (l2 + l2) +
                                 d_l0[lVar12] * (l0 + l0) + d_l1[lVar12] * (l1 + l1);
                          }
                          dVar16 = l5 * l5 + l4 * l4 + l3 * l3 + l2 * l2 + l0 * l0 + l1 * l1;
                          dVar15 = dVar16 * 1e+20;
                          if (dVar15 <= -dVar15) {
                            dVar15 = -dVar15;
                          }
                          dVar18 = -dVar14;
                          dVar13 = dVar14;
                          if (dVar14 <= dVar18) {
                            dVar13 = dVar18;
                          }
                          if (dVar13 < dVar15) {
                            *quality = (dVar14 * 24.9610058766228) / dVar16;
                            for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                              d_quality[lVar12] =
                                   (((d_num[lVar12] * dVar16 + d_denom[lVar12] * dVar18) *
                                    24.9610058766228) / dVar16) / dVar16;
                            }
                            return 0;
                          }
                          *quality = -1.0;
                          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                            d_quality[lVar12] = 0.0;
                          }
                          return 0;
                        }
                        uVar10 = (ulong)uVar8;
                        pcVar11 = "n3";
                        uVar9 = 0x6cf;
                      }
                      else {
                        uVar10 = (ulong)uVar8;
                        pcVar11 = "n2";
                        uVar9 = 0x6cb;
                      }
                    }
                    else {
                      uVar10 = (ulong)uVar8;
                      pcVar11 = "n1";
                      uVar9 = 0x6c7;
                    }
                  }
                  else {
                    uVar10 = (ulong)uVar8;
                    pcVar11 = "n0";
                    uVar9 = 0x6c3;
                  }
                }
                else {
                  uVar10 = (ulong)uVar8;
                  pcVar11 = "vol";
                  uVar9 = 0x6ba;
                }
              }
              else {
                uVar10 = (ulong)uVar8;
                pcVar11 = "l5";
                uVar9 = 0x6b8;
              }
            }
            else {
              uVar10 = (ulong)uVar8;
              pcVar11 = "l4";
              uVar9 = 0x6b7;
            }
          }
          else {
            uVar10 = (ulong)uVar8;
            pcVar11 = "l3";
            uVar9 = 0x6b6;
          }
        }
        else {
          uVar10 = (ulong)uVar8;
          pcVar11 = "l2";
          uVar9 = 0x6b5;
        }
      }
      else {
        uVar10 = (ulong)uVar8;
        pcVar11 = "l1";
        uVar9 = 0x6b4;
      }
    }
    else {
      uVar10 = (ulong)uVar8;
      pcVar11 = "l0";
      uVar9 = 0x6b3;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar9,
           "ref_node_tet_epic_dquality_dnode0",uVar10,pcVar11);
    pcVar11 = "epic";
    uVar9 = 0x751;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar9,
         "ref_node_tet_dquality_dnode0",uVar10,pcVar11);
  return (REF_STATUS)uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_dquality_dnode0(REF_NODE ref_node,
                                                REF_INT *nodes,
                                                REF_DBL *quality,
                                                REF_DBL *d_quality) {
  switch (ref_node->tet_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tet_epic_dquality_dnode0(ref_node, nodes, quality,
                                            d_quality),
          "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tet_jac_dquality_dnode0(ref_node, nodes, quality, d_quality),
          "jac");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}